

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O1

void __thiscall deci::dictionary_t::dictionary_t(dictionary_t *this,dictionary_t *copy)

{
  size_type sVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  undefined8 uVar4;
  _Hash_node_base *p_Var5;
  double dVar6;
  undefined8 local_40;
  undefined8 local_38;
  
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0011e2c8;
  (this->storage)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->storage)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->storage)._M_h._M_rehash_policy = 0;
  (this->storage)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->storage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->storage)._M_h._M_buckets = &(this->storage)._M_h._M_single_bucket;
  (this->storage)._M_h._M_bucket_count = 1;
  (this->storage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->storage)._M_h._M_element_count = 0;
  (this->storage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->storage)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->storage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sVar1 = (copy->storage)._M_h._M_element_count;
  dVar6 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  uVar3 = (ulong)dVar6;
  std::
  _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(&(this->storage)._M_h,(long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3
          );
  p_Var5 = (copy->storage)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var5[2]._M_nxt;
      uVar4 = (*(code *)(p_Var5[1]._M_nxt)->_M_nxt[2]._M_nxt)();
      local_38 = (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2);
      local_40 = uVar4;
      std::
      _Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<deci::value_t*,deci::value_t*>>
                ((_Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->storage,&local_40);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

dictionary_t::dictionary_t(const dictionary_t& copy):value_t(), storage() {
    this->storage.reserve(copy.storage.size());
    for (auto el: copy.storage) {
      value_t* key = el.first->Copy();
      value_t* value = el.second->Copy();
      this->storage.insert(std::make_pair(key,value));
    }
  }